

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

long neon_element_offset(int reg,int element,MemOp size)

{
  long lVar1;
  int ofs;
  int element_size;
  MemOp size_local;
  int element_local;
  int reg_local;
  
  lVar1 = neon_reg_offset(reg,0);
  return lVar1 + element * (1 << ((byte)size & 0x1f));
}

Assistant:

static inline long
neon_element_offset(int reg, int element, MemOp size)
{
    int element_size = 1 << size;
    int ofs = element * element_size;
#ifdef HOST_WORDS_BIGENDIAN
    /* Calculate the offset assuming fully little-endian,
     * then XOR to account for the order of the 8-byte units.
     */
    if (element_size < 8) {
        ofs ^= 8 - element_size;
    }
#endif
    return neon_reg_offset(reg, 0) + ofs;
}